

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

size_t __thiscall pbrt::PiecewiseConstant2D::BytesUsed(PiecewiseConstant2D *this)

{
  PiecewiseConstant1D *pPVar1;
  
  pPVar1 = (this->pConditionalV).ptr;
  return (((pPVar1->cdf).nAlloc + (pPVar1->func).nAlloc) * 4 + 0x50) * (this->pConditionalV).nStored
         + ((this->pMarginal).cdf.nAlloc + (this->pMarginal).func.nAlloc) * 4;
}

Assistant:

operator[](size_type index) const {
        DCHECK_LT(index, size());
        return ptr[index];
    }